

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int64_t archive_read_format_rar_seek_data(archive_read *a,int64_t offset,int whence)

{
  byte *pbVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int64_t iVar5;
  ulong uVar6;
  long lVar7;
  char *fmt;
  long lVar8;
  uint uVar9;
  
  pbVar1 = (byte *)a->format->data;
  if (pbVar1[0x17] == 0x30) {
    if (whence == 1) {
      lVar4 = 200;
LAB_006fb16b:
      lVar4 = *(long *)(pbVar1 + lVar4);
    }
    else {
      if (whence == 2) {
        lVar4 = 0x28;
        goto LAB_006fb16b;
      }
      lVar4 = 0;
    }
    lVar4 = lVar4 + offset;
    if (lVar4 < 0) {
      return -1;
    }
    if (*(long *)(pbVar1 + 0x28) < lVar4) {
      *(long *)(pbVar1 + 200) = lVar4;
      lVar4 = *(long *)(pbVar1 + 0x28);
    }
    lVar7 = *(long *)(pbVar1 + 0x100);
    lVar4 = lVar4 + *(long *)(lVar7 + 8);
    uVar6 = (ulong)*(uint *)(pbVar1 + 0x108);
    if (uVar6 != 0) {
      lVar8 = 0;
      do {
        lVar4 = (lVar4 + *(long *)(lVar7 + 0x20 + lVar8)) - *(long *)(lVar7 + 0x10 + lVar8);
        lVar8 = lVar8 + 0x18;
      } while (uVar6 * 0x18 != lVar8);
    }
    if ((*pbVar1 & 1) != 0) {
      do {
        while( true ) {
          iVar3 = (int)uVar6;
          lVar8 = *(long *)(lVar7 + 8 + uVar6 * 0x18);
          if ((lVar4 < lVar8) && ((pbVar1[0x18] & 1) != 0)) break;
          lVar8 = *(long *)(lVar7 + 0x10 + uVar6 * 0x18);
          if ((lVar4 - lVar8 == 0 || lVar4 < lVar8) || ((pbVar1[0x18] & 2) == 0)) goto LAB_006fb1db;
          uVar9 = iVar3 + 1;
          *(uint *)(pbVar1 + 0x108) = uVar9;
          if ((uVar9 < *(uint *)(pbVar1 + 0x10c)) &&
             (*(long *)(lVar7 + 0x10 + (ulong)uVar9 * 0x18) < lVar4)) {
            lVar4 = (lVar4 - lVar8) + *(long *)(lVar7 + (ulong)uVar9 * 0x18 + 8);
            uVar6 = (ulong)uVar9;
          }
          else {
            *(int *)(pbVar1 + 0x108) = iVar3;
            iVar5 = __archive_read_seek(a,lVar8,0);
            if (iVar5 < 0) {
              return iVar5;
            }
            iVar3 = archive_read_format_rar_read_header(a,a->entry);
            if (iVar3 == 1) {
              pbVar1[0xfc] = 1;
              iVar3 = archive_read_format_rar_read_header(a,a->entry);
            }
            if (iVar3 != 0) goto LAB_006fb3a9;
            lVar7 = *(long *)(pbVar1 + 0x100);
            uVar6 = (ulong)*(uint *)(pbVar1 + 0x108);
            lVar4 = (lVar4 + *(long *)(lVar7 + 8 + uVar6 * 0x18)) -
                    *(long *)(lVar7 + 0x10 + (ulong)(*(uint *)(pbVar1 + 0x108) - 1) * 0x18);
          }
        }
        if (iVar3 == 0) {
          fmt = "Attempt to seek past beginning of RAR data block";
          goto LAB_006fb14b;
        }
        uVar6 = (ulong)(iVar3 - 1U);
        *(uint *)(pbVar1 + 0x108) = iVar3 - 1U;
        lVar2 = *(long *)(lVar7 + 8 + uVar6 * 0x18);
        lVar4 = lVar4 + (*(long *)(lVar7 + 0x10 + uVar6 * 0x18) - lVar8);
      } while (lVar4 < lVar2);
      iVar5 = __archive_read_seek(a,lVar2 - *(long *)(lVar7 + uVar6 * 0x18),0);
      if (iVar5 < 0) {
        return iVar5;
      }
      iVar3 = archive_read_format_rar_read_header(a,a->entry);
      if (iVar3 != 0) {
LAB_006fb3a9:
        fmt = "Error during seek of RAR file";
        goto LAB_006fb14b;
      }
      *(int *)(pbVar1 + 0x108) = *(int *)(pbVar1 + 0x108) + -1;
    }
LAB_006fb1db:
    iVar5 = __archive_read_seek(a,lVar4,0);
    if (-1 < iVar5) {
      lVar4 = *(long *)(pbVar1 + 0x100);
      uVar6 = (ulong)*(uint *)(pbVar1 + 0x108);
      *(long *)(pbVar1 + 0xa8) = *(long *)(lVar4 + 0x10 + uVar6 * 0x18) - iVar5;
      if (uVar6 != 0) {
        lVar7 = uVar6 * 0x18;
        do {
          iVar5 = (iVar5 - *(long *)(lVar4 + 8 + lVar7)) + *(long *)(lVar4 + -8 + lVar7);
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      lVar4 = iVar5 - *(long *)(lVar4 + 8);
      __archive_reset_read_data(&a->archive);
      pbVar1[0xa0] = 0;
      pbVar1[0xa1] = 0;
      pbVar1[0xa2] = 0;
      pbVar1[0xa3] = 0;
      pbVar1[0xa4] = 0;
      pbVar1[0xa5] = 0;
      pbVar1[0xa6] = 0;
      pbVar1[0xa7] = 0;
      pbVar1[0xb8] = 0;
      pbVar1[0xb9] = 0;
      pbVar1[0xba] = 0;
      pbVar1[0xbb] = 0;
      pbVar1[0xbc] = 0;
      pbVar1[0xbd] = 0;
      pbVar1[0xbe] = 0;
      pbVar1[0xbf] = 0;
      if ((lVar4 != *(long *)(pbVar1 + 0x28)) ||
         (iVar5 = *(long *)(pbVar1 + 200), *(long *)(pbVar1 + 200) <= lVar4)) {
        *(long *)(pbVar1 + 200) = lVar4;
        iVar5 = lVar4;
      }
    }
  }
  else {
    fmt = "Seeking of compressed RAR files is unsupported";
LAB_006fb14b:
    archive_set_error(&a->archive,-1,fmt);
    iVar5 = -0x19;
  }
  return iVar5;
}

Assistant:

static int64_t
archive_read_format_rar_seek_data(struct archive_read *a, int64_t offset,
    int whence)
{
  int64_t client_offset, ret;
  unsigned int i;
  struct rar *rar = (struct rar *)(a->format->data);

  if (rar->compression_method == COMPRESS_METHOD_STORE)
  {
    /* Modify the offset for use with SEEK_SET */
    switch (whence)
    {
      case SEEK_CUR:
        client_offset = rar->offset_seek;
        break;
      case SEEK_END:
        client_offset = rar->unp_size;
        break;
      case SEEK_SET:
      default:
        client_offset = 0;
    }
    client_offset += offset;
    if (client_offset < 0)
    {
      /* Can't seek past beginning of data block */
      return -1;
    }
    else if (client_offset > rar->unp_size)
    {
      /*
       * Set the returned offset but only seek to the end of
       * the data block.
       */
      rar->offset_seek = client_offset;
      client_offset = rar->unp_size;
    }

    client_offset += rar->dbo[0].start_offset;
    i = 0;
    while (i < rar->cursor)
    {
      i++;
      client_offset += rar->dbo[i].start_offset - rar->dbo[i-1].end_offset;
    }
    if (rar->main_flags & MHD_VOLUME)
    {
      /* Find the appropriate offset among the multivolume archive */
      while (1)
      {
        if (client_offset < rar->dbo[rar->cursor].start_offset &&
          rar->file_flags & FHD_SPLIT_BEFORE)
        {
          /* Search backwards for the correct data block */
          if (rar->cursor == 0)
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Attempt to seek past beginning of RAR data block");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          client_offset -= rar->dbo[rar->cursor+1].start_offset -
            rar->dbo[rar->cursor].end_offset;
          if (client_offset < rar->dbo[rar->cursor].start_offset)
            continue;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor].header_size, SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          rar->cursor--;
          break;
        }
        else if (client_offset > rar->dbo[rar->cursor].end_offset &&
          rar->file_flags & FHD_SPLIT_AFTER)
        {
          /* Search forward for the correct data block */
          rar->cursor++;
          if (rar->cursor < rar->nodes &&
            client_offset > rar->dbo[rar->cursor].end_offset)
          {
            client_offset += rar->dbo[rar->cursor].start_offset -
              rar->dbo[rar->cursor-1].end_offset;
            continue;
          }
          rar->cursor--;
          ret = __archive_read_seek(a, rar->dbo[rar->cursor].end_offset,
                                    SEEK_SET);
          if (ret < (ARCHIVE_OK))
            return ret;
          ret = archive_read_format_rar_read_header(a, a->entry);
          if (ret == (ARCHIVE_EOF))
          {
            rar->has_endarc_header = 1;
            ret = archive_read_format_rar_read_header(a, a->entry);
          }
          if (ret != (ARCHIVE_OK))
          {
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
              "Error during seek of RAR file");
            return (ARCHIVE_FAILED);
          }
          client_offset += rar->dbo[rar->cursor].start_offset -
            rar->dbo[rar->cursor-1].end_offset;
          continue;
        }
        break;
      }
    }

    ret = __archive_read_seek(a, client_offset, SEEK_SET);
    if (ret < (ARCHIVE_OK))
      return ret;
    rar->bytes_remaining = rar->dbo[rar->cursor].end_offset - ret;
    i = rar->cursor;
    while (i > 0)
    {
      i--;
      ret -= rar->dbo[i+1].start_offset - rar->dbo[i].end_offset;
    }
    ret -= rar->dbo[0].start_offset;

    /* Always restart reading the file after a seek */
    __archive_reset_read_data(&a->archive);

    rar->bytes_unconsumed = 0;
    rar->offset = 0;

    /*
     * If a seek past the end of file was requested, return the requested
     * offset.
     */
    if (ret == rar->unp_size && rar->offset_seek > rar->unp_size)
      return rar->offset_seek;

    /* Return the new offset */
    rar->offset_seek = ret;
    return rar->offset_seek;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
      "Seeking of compressed RAR files is unsupported");
  }
  return (ARCHIVE_FAILED);
}